

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabel::contextMenuEvent(QLabel *this,QContextMenuEvent *ev)

{
  QLabelPrivate *this_00;
  QWidget *this_01;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if ((this_00->field_0x340 & 0x10) != 0) {
    this_01 = &QLabelPrivate::createStandardContextMenu(this_00,(QPoint *)(ev + 0x28))->
               super_QWidget;
    if (this_01 != (QWidget *)0x0) {
      ev[0xc] = (QContextMenuEvent)0x1;
      QWidget::setAttribute(this_01,WA_DeleteOnClose,true);
      QMenu::popup((QMenu *)this_01,(QPoint *)(ev + 0x30),(QAction *)0x0);
      return;
    }
  }
  ev[0xc] = (QContextMenuEvent)0x0;
  return;
}

Assistant:

void QLabel::contextMenuEvent(QContextMenuEvent *ev)
{
    Q_D(QLabel);
    if (!d->isTextLabel) {
        ev->ignore();
        return;
    }
    QMenu *menu = d->createStandardContextMenu(ev->pos());
    if (!menu) {
        ev->ignore();
        return;
    }
    ev->accept();
    menu->setAttribute(Qt::WA_DeleteOnClose);
    menu->popup(ev->globalPos());
}